

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O2

void __thiscall
Corrade::Utility::Configuration::save
          (Configuration *this,ostream *out,string *eol,ConfigurationGroup *group,string *fullPath)

{
  string *__rhs;
  pointer pVVar1;
  size_type sVar2;
  byte *pbVar3;
  pointer pGVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  ostream *output;
  ConfigurationGroup *group_00;
  pointer __lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  long local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string *local_130;
  ConfigurationGroup *local_128;
  string buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string valueString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_130 = fullPath;
  if (group->_configuration != this) {
    output = Error::defaultOutput();
    Error::Error((Error *)&buffer,output,(Flags)0x0);
    Debug::operator<<((Debug *)&buffer,
                      "Assertion group->configuration() == this failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Configuration.cpp:312"
                     );
    Error::~Error((Error *)&buffer);
    abort();
  }
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  buffer._M_string_length = 0;
  buffer.field_2._M_local_buf[0] = '\0';
  __lhs = (group->_values).
          super__Vector_base<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pVVar1 = (group->_values).
           super__Vector_base<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_128 = group;
  do {
    if (__lhs == pVVar1) {
      local_168 = 0;
      lVar6 = 0;
      while( true ) {
        pGVar4 = (local_128->_groups).
                 super__Vector_base<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (lVar6 == ((long)(local_128->_groups).
                            super__Vector_base<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar4) / 0x28)
        break;
        pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(pGVar4->name)._M_dataplus._M_p + local_168);
        std::__cxx11::string::string((string *)&valueString,(string *)pbVar8);
        if (local_130->_M_string_length != 0) {
          std::operator+(&local_150,local_130,'/');
          std::operator+(&local_d0,&local_150,&valueString);
          std::__cxx11::string::operator=((string *)&valueString,(string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_150);
        }
        if ((((lVar6 != 0) &&
             (bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&(local_128->_groups).
                                                 super__Vector_base<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[-1].name.
                                                 _M_dataplus._M_p + local_168),pbVar8), !bVar5)) ||
            (group_00 = *(ConfigurationGroup **)((long)&pGVar4->group + local_168),
            (group_00->_values).
            super__Vector_base<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (group_00->_values).
            super__Vector_base<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
            ._M_impl.super__Vector_impl_data._M_finish)) ||
           ((group_00->_groups).
            super__Vector_base<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (group_00->_groups).
            super__Vector_base<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          std::operator+(&local_f0,'[',&valueString);
          std::operator+(&local_150,&local_f0,']');
          std::operator+(&local_d0,&local_150,eol);
          std::__cxx11::string::operator=((string *)&buffer,(string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::~string((string *)&local_f0);
          std::ostream::write((char *)out,(long)buffer._M_dataplus._M_p);
          group_00 = *(ConfigurationGroup **)((long)&pGVar4->group + local_168);
        }
        save(this,out,eol,group_00,&valueString);
        std::__cxx11::string::~string((string *)&valueString);
        lVar6 = lVar6 + 1;
        local_168 = local_168 + 0x28;
      }
      std::__cxx11::string::~string((string *)&buffer);
      return;
    }
    pbVar8 = &valueString;
    if ((__lhs->key)._M_string_length == 0) {
      std::operator+(&valueString,&__lhs->value,eol);
      std::__cxx11::string::operator=((string *)&buffer,(string *)&valueString);
    }
    else {
      __rhs = &__lhs->value;
      lVar6 = std::__cxx11::string::find((char)__rhs,10);
      if (lVar6 == -1) {
        sVar2 = (__lhs->value)._M_string_length;
        if (sVar2 != 0) {
          pbVar3 = (byte *)(__rhs->_M_dataplus)._M_p;
          uVar7 = (ulong)*pbVar3;
          if (((uVar7 < 0x21) && ((0x100003e00U >> (uVar7 & 0x3f) & 1) != 0)) ||
             ((uVar7 = (ulong)pbVar3[sVar2 - 1], uVar7 < 0x21 &&
              ((0x100003e00U >> (uVar7 & 0x3f) & 1) != 0)))) {
            std::operator+(&local_f0,&__lhs->key,"=\"");
            std::operator+(&local_150,&local_f0,__rhs);
            std::operator+(&local_d0,&local_150,'\"');
            std::operator+(&valueString,&local_d0,eol);
            std::__cxx11::string::operator=((string *)&buffer,(string *)&valueString);
            std::__cxx11::string::~string((string *)&valueString);
            std::__cxx11::string::~string((string *)&local_d0);
            std::__cxx11::string::~string((string *)&local_150);
            pbVar8 = &local_f0;
            goto LAB_00113e58;
          }
        }
        std::operator+(&local_150,&__lhs->key,'=');
        std::operator+(&local_d0,&local_150,__rhs);
        std::operator+(&valueString,&local_d0,eol);
        std::__cxx11::string::operator=((string *)&buffer,(string *)&valueString);
        std::__cxx11::string::~string((string *)&valueString);
        std::__cxx11::string::~string((string *)&local_d0);
        pbVar8 = &local_150;
      }
      else {
        std::__cxx11::string::string((string *)&valueString,(string *)__rhs);
        while (uVar7 = std::__cxx11::string::find((char)&valueString,10),
              uVar7 != 0xffffffffffffffff) {
          std::__cxx11::string::replace((ulong)&valueString,uVar7,(string *)0x1);
        }
        std::operator+(&local_90,&__lhs->key,"=\"\"\"");
        std::operator+(&local_70,&local_90,eol);
        std::operator+(&local_50,&local_70,&valueString);
        std::operator+(&local_f0,&local_50,eol);
        std::operator+(&local_150,&local_f0,"\"\"\"");
        std::operator+(&local_d0,&local_150,eol);
        std::__cxx11::string::operator=((string *)&buffer,(string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
      }
    }
LAB_00113e58:
    std::__cxx11::string::~string((string *)pbVar8);
    std::ostream::write((char *)out,(long)buffer._M_dataplus._M_p);
    __lhs = __lhs + 1;
  } while( true );
}

Assistant:

void Configuration::save(std::ostream& out, const std::string& eol, ConfigurationGroup* group, const std::string& fullPath) const {
    CORRADE_INTERNAL_ASSERT(group->configuration() == this);
    std::string buffer;

    /* Foreach all items in the group */
    for(const Value& value: group->_values) {
        /* Key/value pair */
        if(!value.key.empty()) {
            /* Multi-line value */
            if(value.value.find_first_of('\n') != std::string::npos) {
                /* Replace \n with `eol` */
                /** @todo fixme: ugly and slow */
                std::string valueString = value.value;
                std::size_t pos = 0;
                while((pos = valueString.find_first_of('\n', pos)) != std::string::npos) {
                    valueString.replace(pos, 1, eol);
                    pos += eol.size();
                }

                buffer = value.key + "=\"\"\"" + eol + valueString + eol + "\"\"\"" + eol;

            /* Value with leading/trailing spaces */
            } else if(!value.value.empty() && (isWhitespace(value.value.front()) || isWhitespace(value.value.back()))) {
                buffer = value.key + "=\"" + value.value + '"' + eol;

            /* Value without spaces */
            } else buffer = value.key + '=' + value.value + eol;
        }

        /* Comment / empty line */
        else buffer = value.value + eol;

        out.write(buffer.data(), buffer.size());
    }

    /* Recursively process all subgroups */
    for(std::size_t i = 0; i != group->_groups.size(); ++i) {
        const Group& g = group->_groups[i];

        /* Subgroup name */
        std::string name = g.name;
        if(!fullPath.empty()) name = fullPath + '/' + name;

        /* Omit the name if the group is a first subgroup of given name, has no
           values and only subgroups */
        if(!((i == 0 || group->_groups[i - 1].name != g.name) && g.group->_values.empty() && !g.group->_groups.empty())) {
            buffer = '[' + name + ']' + eol;
            out.write(buffer.data(), buffer.size());
        }

        save(out, eol, g.group, name);
    }
}